

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)21>_> *
vkt::api::anon_unknown_1::DescriptorPool::create
          (Move<vk::Handle<(vk::HandleType)21>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  ulong uVar1;
  VkDescriptorPoolCreateInfo local_30;
  
  local_30.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  local_30.pNext = (void *)0x0;
  local_30._16_8_ = *(undefined8 *)param_2;
  uVar1 = *(long *)(param_2 + 0x10) - (long)*(VkDescriptorPoolSize **)(param_2 + 8);
  local_30.pPoolSizes = (VkDescriptorPoolSize *)0x0;
  if (uVar1 != 0) {
    local_30.pPoolSizes = *(VkDescriptorPoolSize **)(param_2 + 8);
  }
  local_30.poolSizeCount = (deUint32)(uVar1 >> 3);
  ::vk::createDescriptorPool
            (__return_storage_ptr__,env->vkd,env->device,&local_30,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkDescriptorPool> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkDescriptorPoolCreateInfo	descriptorPoolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			params.flags,
			params.maxSets,
			(deUint32)params.poolSizes.size(),
			(params.poolSizes.empty() ? DE_NULL : &params.poolSizes[0])
		};

		return createDescriptorPool(env.vkd, env.device, &descriptorPoolInfo, env.allocationCallbacks);
	}